

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_widget_layout_states nk_widget(nk_rect *bounds,nk_context *ctx)

{
  float fVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  nk_widget_layout_states nVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  nVar3 = NK_WIDGET_INVALID;
  nVar4 = NK_WIDGET_INVALID;
  if (((ctx != (nk_context *)0x0) && (nVar4 = nVar3, ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    nk_panel_alloc_space(bounds,ctx);
    pnVar2 = ctx->current->layout;
    fVar9 = bounds->w;
    fVar1 = bounds->h;
    fVar5 = (float)(int)bounds->x;
    fVar6 = (float)(int)bounds->y;
    fVar7 = (pnVar2->clip).x;
    fVar8 = (pnVar2->clip).y;
    fVar11 = (pnVar2->clip).w;
    fVar12 = (pnVar2->clip).h;
    bounds->x = fVar5;
    bounds->y = fVar6;
    bounds->w = (float)(int)fVar9;
    bounds->h = (float)(int)fVar1;
    fVar10 = (float)(int)fVar7;
    fVar7 = (float)(int)fVar11 + fVar10;
    if ((fVar5 < fVar7) && (fVar11 = (float)(int)fVar9 + fVar5, fVar10 < fVar11)) {
      fVar9 = (float)(int)fVar8;
      fVar8 = (float)(int)fVar12 + fVar9;
      if ((fVar6 < fVar8) && (fVar12 = (float)(int)fVar1 + fVar6, fVar9 < fVar12)) {
        if (fVar5 <= fVar10) {
          fVar5 = fVar10;
        }
        fVar1 = (ctx->input).mouse.pos.x;
        nVar4 = NK_WIDGET_ROM;
        if (fVar5 <= fVar1) {
          if (fVar11 <= fVar7) {
            fVar7 = fVar11;
          }
          fVar11 = fVar7 - fVar5;
          if (fVar7 - fVar5 <= 0.0) {
            fVar11 = 0.0;
          }
          if (fVar1 < fVar11 + fVar5) {
            if (fVar6 <= fVar9) {
              fVar6 = fVar9;
            }
            if (fVar12 <= fVar8) {
              fVar8 = fVar12;
            }
            fVar8 = fVar8 - fVar6;
            if (fVar8 <= 0.0) {
              fVar8 = 0.0;
            }
            fVar7 = (ctx->input).mouse.pos.y;
            nVar4 = NK_WIDGET_ROM - (fVar7 < fVar8 + fVar6 && fVar6 <= fVar7);
          }
        }
      }
    }
  }
  return nVar4;
}

Assistant:

NK_API enum nk_widget_layout_states
nk_widget(struct nk_rect *bounds, const struct nk_context *ctx)
{
struct nk_rect c, v;
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return NK_WIDGET_INVALID;

/* allocate space and check if the widget needs to be updated and drawn */
nk_panel_alloc_space(bounds, ctx);
win = ctx->current;
layout = win->layout;
in = &ctx->input;
c = layout->clip;

/*  if one of these triggers you forgot to add an `if` condition around either
        a window, group, popup, combobox or contextual menu `begin` and `end` block.
        Example:
            if (nk_begin(...) {...} nk_end(...); or
            if (nk_group_begin(...) { nk_group_end(...);} */
NK_ASSERT(!(layout->flags & NK_WINDOW_MINIMIZED));
NK_ASSERT(!(layout->flags & NK_WINDOW_HIDDEN));
NK_ASSERT(!(layout->flags & NK_WINDOW_CLOSED));

/* need to convert to int here to remove floating point errors */
bounds->x = (float)((int)bounds->x);
bounds->y = (float)((int)bounds->y);
bounds->w = (float)((int)bounds->w);
bounds->h = (float)((int)bounds->h);

c.x = (float)((int)c.x);
c.y = (float)((int)c.y);
c.w = (float)((int)c.w);
c.h = (float)((int)c.h);

nk_unify(&v, &c, bounds->x, bounds->y, bounds->x + bounds->w, bounds->y + bounds->h);
if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds->x, bounds->y, bounds->w, bounds->h))
return NK_WIDGET_INVALID;
if (!NK_INBOX(in->mouse.pos.x, in->mouse.pos.y, v.x, v.y, v.w, v.h))
return NK_WIDGET_ROM;
return NK_WIDGET_VALID;
}